

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::cpp::CppGenerator::~CppGenerator(CppGenerator *this)

{
  ~CppGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

CppGenerator::~CppGenerator() {}